

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Swap
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_28 [8];
  RepeatedField<unsigned_int> temp;
  RepeatedField<unsigned_int> *other_local;
  RepeatedField<unsigned_int> *this_local;
  
  if (this != other) {
    temp.rep_ = (Rep *)other;
    pAVar1 = GetArenaNoVirtual(this);
    pAVar2 = GetArenaNoVirtual((RepeatedField<unsigned_int> *)temp.rep_);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,(RepeatedField<unsigned_int> *)temp.rep_);
    }
    else {
      pAVar1 = GetArenaNoVirtual((RepeatedField<unsigned_int> *)temp.rep_);
      RepeatedField((RepeatedField<unsigned_int> *)local_28,pAVar1);
      MergeFrom((RepeatedField<unsigned_int> *)local_28,this);
      CopyFrom(this,(RepeatedField<unsigned_int> *)temp.rep_);
      UnsafeArenaSwap((RepeatedField<unsigned_int> *)temp.rep_,
                      (RepeatedField<unsigned_int> *)local_28);
      ~RepeatedField((RepeatedField<unsigned_int> *)local_28);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}